

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
::allocateBuckets(DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
                  *this,uint Num)

{
  DenseSetPair<llbuild::core::CancellationDelegate_*> *pDVar1;
  bool bVar2;
  uint Num_local;
  DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
  *this_local;
  
  this->NumBuckets = Num;
  bVar2 = this->NumBuckets != 0;
  if (bVar2) {
    pDVar1 = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)
             operator_new((ulong)this->NumBuckets << 3);
    this->Buckets = pDVar1;
  }
  else {
    this->Buckets = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0;
  }
  return bVar2;
}

Assistant:

bool allocateBuckets(unsigned Num) {
    NumBuckets = Num;
    if (NumBuckets == 0) {
      Buckets = nullptr;
      return false;
    }

    Buckets = static_cast<BucketT*>(operator new(sizeof(BucketT) * NumBuckets));
    return true;
  }